

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualBoundViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  int iVar5;
  undefined8 *puVar6;
  long lVar7;
  cpp_dec_float<100U,_int,_void> *pcVar8;
  long lVar9;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_140;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint local_a8 [3];
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58 [3];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_140,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_140);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_128,0.0);
      if ((*(int *)((long)(&((local_140.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                   lVar7 + 8) == 2) ||
         (pnVar2 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar7 + 8U) == 2)) {
LAB_0039c480:
        if ((*(int *)((long)(&((local_140.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                     lVar7 + 8) != 2) &&
           (pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar7 + 8U) != 2)) {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)
                             ((long)((local_140.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar7),
                             (cpp_dec_float<100U,_int,_void> *)
                             ((long)(pnVar2->m_backend).data._M_elems + lVar7));
          if (0 < iVar5) {
            pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                     ((long)((local_140.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar7);
            pcVar8 = (cpp_dec_float<100U,_int,_void> *)
                     ((long)(((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .up.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar7);
            local_90._0_4_ = cpp_dec_float_finite;
            local_90._4_4_ = 0x10;
            local_d8 = (undefined1  [16])0x0;
            local_c8 = (undefined1  [16])0x0;
            local_b8 = (undefined1  [16])0x0;
            local_a8[0] = 0;
            local_a8[1] = 0;
            stack0xffffffffffffff60 = 0;
            uStack_9b = 0;
            iStack_98 = 0;
            bStack_94 = false;
            if (pcVar8 == (cpp_dec_float<100U,_int,_void> *)local_d8) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_d8,pcVar1);
              if (local_d8._0_4_ != 0 || (fpclass_type)local_90 != cpp_dec_float_finite) {
                bStack_94 = (bool)(bStack_94 ^ 1);
              }
            }
            else {
              if (pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_d8) {
                local_d8 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
                local_c8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
                local_b8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
                local_a8._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
                stack0xffffffffffffff60 = (undefined5)uVar3;
                uStack_9b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_98 = *(int *)((long)(&((local_140.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_backend
                                             ).data + 1) + lVar7);
                bStack_94 = *(bool *)((long)(&((local_140.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              m_backend).data + 1) + lVar7 + 4);
                local_90 = *(undefined8 *)
                            ((long)(&((local_140.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                                   1) + lVar7 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_d8,pcVar8);
            }
            local_128.neg = bStack_94;
            if (bStack_94 == true) {
              local_128.neg = (fpclass_type)local_90 == cpp_dec_float_finite && local_d8._0_4_ == 0;
            }
            local_128.data._M_elems[0] = local_d8._0_4_;
            puVar4 = local_d8;
            local_128.exp = iStack_98;
            local_128._72_8_ = local_90;
            goto LAB_0039c6ee;
          }
        }
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)
                           ((long)((local_140.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar7),
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(pnVar2->m_backend).data._M_elems + lVar7));
        if (-1 < iVar5) goto LAB_0039c480;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)((local_140.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar7);
        pcVar8 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)(((this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar7);
        local_40._0_4_ = cpp_dec_float_finite;
        local_40._4_4_ = 0x10;
        local_88 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_58[0] = 0;
        local_58[1] = 0;
        stack0xffffffffffffffb0 = 0;
        uStack_4b = 0;
        iStack_48 = 0;
        bStack_44 = false;
        if (pcVar8 == (cpp_dec_float<100U,_int,_void> *)local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_88,pcVar1);
          if (local_88._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
            bStack_44 = (bool)(bStack_44 ^ 1);
          }
        }
        else {
          if (pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_88) {
            local_88 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_78 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
            local_68 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
            local_58._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            stack0xffffffffffffffb0 = (undefined5)uVar3;
            uStack_4b = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_48 = *(int *)((long)(&((local_140.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data + 1) + lVar7);
            bStack_44 = *(bool *)((long)(&((local_140.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          data + 1) + lVar7 + 4);
            local_40 = *(undefined8 *)
                        ((long)(&((local_140.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                        + lVar7 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_88,pcVar8);
        }
        local_128.neg = bStack_44;
        if (bStack_44 == true) {
          local_128.neg = (fpclass_type)local_40 == cpp_dec_float_finite && local_88._0_4_ == 0;
        }
        local_128.data._M_elems[0] = local_88._0_4_;
        puVar4 = local_88;
        local_128.exp = iStack_48;
        local_128._72_8_ = local_40;
LAB_0039c6ee:
        puVar6 = (undefined8 *)(puVar4 + 4);
        local_128.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)(puVar4 + 0x30) >> 0x20);
        local_128.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar4 + 0x38),0);
        local_128.data._M_elems[0xf]._1_3_ =
             (undefined3)((ulong)*(undefined8 *)(puVar4 + 0x38) >> 0x28);
        local_128.data._M_elems[9] = (uint)puVar6[4];
        local_128.data._M_elems[10] = (uint)((ulong)puVar6[4] >> 0x20);
        local_128.data._M_elems[0xb] = (uint)puVar6[5];
        local_128.data._M_elems[0xc] = (uint)((ulong)puVar6[5] >> 0x20);
        local_128.data._M_elems[5] = (uint)puVar6[2];
        local_128.data._M_elems[6] = (uint)((ulong)puVar6[2] >> 0x20);
        local_128.data._M_elems[7] = (uint)puVar6[3];
        local_128.data._M_elems[8] = (uint)((ulong)puVar6[3] >> 0x20);
        local_128.data._M_elems[1] = (uint)*puVar6;
        local_128.data._M_elems[2] = (uint)((ulong)*puVar6 >> 0x20);
        local_128.data._M_elems[3] = (uint)puVar6[1];
        local_128.data._M_elems[4] = (uint)((ulong)puVar6[1] >> 0x20);
      }
      if ((local_128.fpclass != cpp_dec_float_NaN) &&
         ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_128,&maxviol->m_backend);
        if (0 < iVar5) {
          *(ulong *)((maxviol->m_backend).data._M_elems + 0xc) =
               CONCAT44(local_128.data._M_elems[0xd],local_128.data._M_elems[0xc]);
          *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
          *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
               CONCAT44(local_128.data._M_elems[9],local_128.data._M_elems[8]);
          *(ulong *)((maxviol->m_backend).data._M_elems + 10) =
               CONCAT44(local_128.data._M_elems[0xb],local_128.data._M_elems[10]);
          *(ulong *)((maxviol->m_backend).data._M_elems + 4) =
               CONCAT44(local_128.data._M_elems[5],local_128.data._M_elems[4]);
          *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
               CONCAT44(local_128.data._M_elems[7],local_128.data._M_elems[6]);
          *(ulong *)(maxviol->m_backend).data._M_elems =
               CONCAT44(local_128.data._M_elems[1],local_128.data._M_elems[0]);
          *(ulong *)((maxviol->m_backend).data._M_elems + 2) =
               CONCAT44(local_128.data._M_elems[3],local_128.data._M_elems[2]);
          (maxviol->m_backend).exp = local_128.exp;
          (maxviol->m_backend).neg = local_128.neg;
          (maxviol->m_backend).fpclass = local_128.fpclass;
          (maxviol->m_backend).prec_elem = local_128.prec_elem;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&sumviol->m_backend,&local_128);
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x50;
    } while (lVar9 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (local_140.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualBoundViolation(
   R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int col = 0; col < this->nCols(); ++col)
   {
      assert(this->lower(col) <= this->upper(col) + 1e-9);

      R viol = 0.0;

      if(solu[col] < this->lower(col))
         viol = spxAbs(solu[col] - this->lower(col));
      else if(solu[col] > this->upper(col))
         viol = spxAbs(solu[col] - this->upper(col));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}